

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O0

char * wabt::GetDecompTypeName(Type t)

{
  Enum EVar1;
  Type local_18;
  Type t_local;
  
  local_18 = t;
  EVar1 = Type::operator_cast_to_Enum(&local_18);
  switch(EVar1) {
  case I8U:
    t_local = (Type)anon_var_dwarf_1290e6;
    break;
  case I16U:
    t_local = (Type)anon_var_dwarf_1290f0;
    break;
  case I32U:
    t_local = (Type)anon_var_dwarf_1290fa;
    break;
  case Void:
    t_local = (Type)anon_var_dwarf_acf38;
    break;
  default:
    t_local = (Type)anon_var_dwarf_12914a;
    break;
  case Func:
    t_local = (Type)((long)"; // func" + 5);
    break;
  case ExternRef:
    t_local = (Type)anon_var_dwarf_acf4e;
    break;
  case FuncRef:
    t_local = (Type)anon_var_dwarf_acf16;
    break;
  case I16:
    t_local = (Type)((long)"ushort" + 1);
    break;
  case I8:
    t_local = (Type)((long)"ubyte" + 1);
    break;
  case V128:
    t_local = (Type)((long)"enable-relaxed-simd" + 0xf);
    break;
  case F64:
    t_local = (Type)anon_var_dwarf_b70d4;
    break;
  case F32:
    t_local = (Type)anon_var_dwarf_b70c8;
    break;
  case I64:
    t_local = (Type)anon_var_dwarf_129104;
    break;
  case I32:
    t_local = (Type)((long)"disable-saturating-float-to-int" + 0x1c);
  }
  return (char *)t_local;
}

Assistant:

inline const char* GetDecompTypeName(Type t) {
  switch (t) {
    case Type::I8: return "byte";
    case Type::I8U: return "ubyte";
    case Type::I16: return "short";
    case Type::I16U: return "ushort";
    case Type::I32: return "int";
    case Type::I32U: return "uint";
    case Type::I64: return "long";
    case Type::F32: return "float";
    case Type::F64: return "double";
    case Type::V128: return "simd";
    case Type::Func: return "func";
    case Type::FuncRef: return "funcref";
    case Type::ExternRef: return "externref";
    case Type::Void: return "void";
    default: return "ILLEGAL";
  }
}